

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pager_write(PgHdr *pPg)

{
  u8 uVar1;
  u32 i;
  Pager *pPager;
  sqlite3_vfs *pVfs;
  sqlite3_file *psVar2;
  int iVar3;
  int iVar4;
  MemJournal *p;
  Bitvec *pBVar5;
  bool bVar6;
  
  pPager = pPg->pPager;
  if (pPager->eState == '\x02') {
    if (pPager->errCode != 0) {
      return pPager->errCode;
    }
    if ((pPager->pWal == (Wal *)0x0) && (pPager->journalMode != '\x02')) {
      pVfs = pPager->pVfs;
      pBVar5 = sqlite3BitvecCreate(pPager->dbSize);
      pPager->pInJournal = pBVar5;
      iVar3 = sqlite3Config.nStmtSpill;
      if (pBVar5 == (Bitvec *)0x0) {
        return 7;
      }
      psVar2 = pPager->jfd;
      if (psVar2->pMethods == (sqlite3_io_methods *)0x0) {
        if (pPager->journalMode == '\x04') {
          psVar2->pMethods = (sqlite3_io_methods *)0x0;
          psVar2[1].pMethods = (sqlite3_io_methods *)0x0;
          psVar2[6].pMethods = (sqlite3_io_methods *)0x0;
          psVar2[7].pMethods = (sqlite3_io_methods *)0x0;
          psVar2[8].pMethods = (sqlite3_io_methods *)0x0;
          psVar2[9].pMethods = (sqlite3_io_methods *)0x0;
          psVar2[4].pMethods = (sqlite3_io_methods *)0x0;
          psVar2[5].pMethods = (sqlite3_io_methods *)0x0;
          psVar2[2].pMethods = (sqlite3_io_methods *)0x0;
          psVar2[3].pMethods = (sqlite3_io_methods *)0x0;
          psVar2[1].pMethods = (sqlite3_io_methods *)0xffffffff000003f8;
          psVar2->pMethods = &MemJournalMethods;
          *(undefined4 *)&psVar2[7].pMethods = 0;
        }
        else {
          uVar1 = pPager->tempFile;
          iVar4 = databaseIsUnmoved(pPager);
          if (iVar4 == 0) {
            bVar6 = uVar1 == '\0';
            if (bVar6) {
              iVar3 = 0;
            }
            iVar4 = 0x101e;
            if (bVar6) {
              iVar4 = 0x806;
            }
            iVar4 = sqlite3JournalOpen(pVfs,pPager->zJournal,pPager->jfd,iVar4,iVar3);
          }
          if (iVar4 != 0) goto LAB_0013aae9;
        }
      }
      pPager->nRec = 0;
      pPager->setSuper = '\0';
      pPager->journalOff = 0;
      pPager->journalHdr = 0;
      iVar4 = writeJournalHdr(pPager);
      if (iVar4 != 0) {
LAB_0013aae9:
        sqlite3BitvecDestroy(pPager->pInJournal);
        pPager->pInJournal = (Bitvec *)0x0;
        pPager->journalOff = 0;
        return iVar4;
      }
    }
    pPager->eState = '\x03';
  }
  sqlite3PcacheMakeDirty(pPg);
  if (pPager->pInJournal != (Bitvec *)0x0) {
    i = pPg->pgno;
    iVar3 = sqlite3BitvecTestNotNull(pPager->pInJournal,i);
    if (iVar3 == 0) {
      if (pPager->dbOrigSize < i) {
        if (pPager->eState != '\x04') {
          *(byte *)&pPg->flags = (byte)pPg->flags | 8;
        }
      }
      else {
        iVar3 = pagerAddPageToRollbackJournal(pPg);
        if (iVar3 != 0) {
          return iVar3;
        }
      }
    }
  }
  *(byte *)&pPg->flags = (byte)pPg->flags | 4;
  if (pPager->nSavepoint < 1) {
    iVar3 = 0;
  }
  else {
    iVar3 = subjournalPageIfRequired(pPg);
  }
  if (pPager->dbSize < pPg->pgno) {
    pPager->dbSize = pPg->pgno;
  }
  return iVar3;
}

Assistant:

static int pager_write(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  int rc = SQLITE_OK;

  /* This routine is not called unless a write-transaction has already
  ** been started. The journal file may or may not be open at this point.
  ** It is never called in the ERROR state.
  */
  assert( pPager->eState==PAGER_WRITER_LOCKED
       || pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
  );
  assert( assert_pager_state(pPager) );
  assert( pPager->errCode==0 );
  assert( pPager->readOnly==0 );
  CHECK_PAGE(pPg);

  /* The journal file needs to be opened. Higher level routines have already
  ** obtained the necessary locks to begin the write-transaction, but the
  ** rollback journal might not yet be open. Open it now if this is the case.
  **
  ** This is done before calling sqlite3PcacheMakeDirty() on the page.
  ** Otherwise, if it were done after calling sqlite3PcacheMakeDirty(), then
  ** an error might occur and the pager would end up in WRITER_LOCKED state
  ** with pages marked as dirty in the cache.
  */
  if( pPager->eState==PAGER_WRITER_LOCKED ){
    rc = pager_open_journal(pPager);
    if( rc!=SQLITE_OK ) return rc;
  }
  assert( pPager->eState>=PAGER_WRITER_CACHEMOD );
  assert( assert_pager_state(pPager) );

  /* Mark the page that is about to be modified as dirty. */
  sqlite3PcacheMakeDirty(pPg);

  /* If a rollback journal is in use, them make sure the page that is about
  ** to change is in the rollback journal, or if the page is a new page off
  ** then end of the file, make sure it is marked as PGHDR_NEED_SYNC.
  */
  assert( (pPager->pInJournal!=0) == isOpen(pPager->jfd) );
  if( pPager->pInJournal!=0
   && sqlite3BitvecTestNotNull(pPager->pInJournal, pPg->pgno)==0
  ){
    assert( pagerUseWal(pPager)==0 );
    if( pPg->pgno<=pPager->dbOrigSize ){
      rc = pagerAddPageToRollbackJournal(pPg);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }else{
      if( pPager->eState!=PAGER_WRITER_DBMOD ){
        pPg->flags |= PGHDR_NEED_SYNC;
      }
      PAGERTRACE(("APPEND %d page %d needSync=%d\n",
              PAGERID(pPager), pPg->pgno,
             ((pPg->flags&PGHDR_NEED_SYNC)?1:0)));
    }
  }

  /* The PGHDR_DIRTY bit is set above when the page was added to the dirty-list
  ** and before writing the page into the rollback journal.  Wait until now,
  ** after the page has been successfully journalled, before setting the
  ** PGHDR_WRITEABLE bit that indicates that the page can be safely modified.
  */
  pPg->flags |= PGHDR_WRITEABLE;

  /* If the statement journal is open and the page is not in it,
  ** then write the page into the statement journal.
  */
  if( pPager->nSavepoint>0 ){
    rc = subjournalPageIfRequired(pPg);
  }

  /* Update the database size and return. */
  if( pPager->dbSize<pPg->pgno ){
    pPager->dbSize = pPg->pgno;
  }
  return rc;
}